

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

void computeParentHash(tree_t *tree,uint child,uint8_t *salt,picnic_instance_t *params)

{
  uint i;
  uint uVar1;
  _Bool _Var2;
  bitset_word_t bVar3;
  uint i_00;
  hash_context ctx;
  
  bVar3 = exists(tree,child);
  if (bVar3 != 0) {
    i_00 = (child + 1 >> 1) - 1;
    _Var2 = haveNode(tree,i_00);
    if (!_Var2) {
      i = i_00 * 2 + 1;
      _Var2 = haveNode(tree,i);
      if ((_Var2) &&
         (uVar1 = i_00 * 4 + 4,
         ((uint)(tree->haveNodeExists[uVar1 >> 6] >> ((byte)uVar1 & 0x3c)) & 3) != 1)) {
        hash_init_prefix(&ctx,(ulong)params->digest_size,'\x03');
        hash_update(&ctx,tree->nodes + i * params->digest_size,(ulong)params->digest_size);
        _Var2 = hasRightChild(tree,i_00);
        if (_Var2) {
          hash_update(&ctx,tree->nodes + (uint)params->digest_size * (i_00 * 2 + 2),
                      (ulong)params->digest_size);
        }
        Keccak_HashUpdate(&ctx,salt,0x100);
        hash_update_uint16_le(&ctx,(uint16_t)i_00);
        hash_final(&ctx);
        hash_squeeze(&ctx,tree->nodes + params->digest_size * i_00,(ulong)params->digest_size);
        markNode(tree,i_00);
      }
    }
  }
  return;
}

Assistant:

static void computeParentHash(tree_t* tree, unsigned int child, uint8_t* salt,
                              const picnic_instance_t* params) {
  if (!exists(tree, child)) {
    return;
  }

  unsigned int parent = getParent(child);
  if (haveNode(tree, parent)) {
    return;
  }

  /* Compute the hash for parent, if we have everything */
  if (!haveNode(tree, 2 * parent + 1)) {
    return;
  }

  if (existsNotHaveNode(tree, 2 * parent + 2)) {
    return;
  }

  /* Compute parent data = H(left child data || [right child data] || salt || parent idx) */
  hash_context ctx;

  hash_init_prefix(&ctx, params->digest_size, HASH_PREFIX_3);
  hash_update(&ctx, &tree->nodes[(2 * parent + 1) * params->digest_size], params->digest_size);
  if (hasRightChild(tree, parent)) {
    /* One node may not have a right child when there's an odd number of leaves */
    hash_update(&ctx, &tree->nodes[(2 * parent + 2) * params->digest_size], params->digest_size);
  }

  hash_update(&ctx, salt, SALT_SIZE);
  hash_update_uint16_le(&ctx, parent);
  hash_final(&ctx);
  hash_squeeze(&ctx, &tree->nodes[parent * params->digest_size], params->digest_size);
  hash_clear(&ctx);
  markNode(tree, parent);
}